

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserUtils.h
# Opt level: O0

bool ODDLParser::isComment<char>(char *in,char *end)

{
  bool bVar1;
  char *drive;
  char *end_local;
  char *in_local;
  
  if (((*in == '/') && (in + 1 != end)) && (in[1] == '/')) {
    bVar1 = isUpperCase<char>(in[2]);
    if (((bVar1) || (bVar1 = isLowerCase<char>(in[2]), bVar1)) && (in[3] == '/')) {
      in_local._7_1_ = false;
    }
    else {
      in_local._7_1_ = true;
    }
  }
  else {
    in_local._7_1_ = false;
  }
  return in_local._7_1_;
}

Assistant:

inline
bool isComment( T *in, T *end ) {
    if ( *in=='/' ) {
        if ( in+1!=end ) {
            if ( *( in+1 )=='/' ) {
                char *drive( ( in+2 ) );
                if ( (isUpperCase<T>( *drive )||isLowerCase<T>( *drive ))&&*( drive+1 )=='/' )  {
                    return false;
                } else {
                    return true;
                }
            }
        }
    }

    return false;
}